

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_hostcheck.c
# Opt level: O1

int amqp_raw_nequal(char *first,char *second,size_t max)

{
  char cVar1;
  char cVar2;
  char cVar3;
  uint uVar4;
  char *pcVar5;
  
  cVar3 = *first;
  if (cVar3 != '\0') {
    pcVar5 = first + 1;
    do {
      cVar2 = *second;
      if ((cVar2 == '\0') || (max == 0)) break;
      cVar1 = amqp_raw_toupper(cVar3);
      cVar2 = amqp_raw_toupper(cVar2);
      if (cVar1 != cVar2) {
        max = 1;
        break;
      }
      max = max - 1;
      second = second + 1;
      cVar3 = *pcVar5;
      pcVar5 = pcVar5 + 1;
    } while (cVar3 != '\0');
  }
  if (max == 0) {
    uVar4 = 1;
  }
  else {
    cVar3 = amqp_raw_toupper(cVar3);
    cVar2 = amqp_raw_toupper(*second);
    uVar4 = (uint)(cVar3 == cVar2);
  }
  return uVar4;
}

Assistant:

static int
amqp_raw_nequal(const char *first, const char *second, size_t max)
{
  while (*first && *second && max) {
    if (amqp_raw_toupper(*first) != amqp_raw_toupper(*second)) {
      break;
    }
    max--;
    first++;
    second++;
  }
  if (0 == max) {
    return 1; /* they are equal this far */
  }
  return amqp_raw_toupper(*first) == amqp_raw_toupper(*second);
}